

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O1

void __thiscall
so_5::disp::mpsc_queue_traits::impl::combined_lock_t::wait_for_notify(combined_lock_t *this)

{
  __atomic_flag_data_type _Var1;
  long lVar2;
  long lVar3;
  long lVar4;
  unique_lock<std::mutex> mlock;
  unique_lock<std::mutex> local_28;
  
  this->m_waiting = true;
  lVar3 = std::chrono::_V2::system_clock::now();
  lVar2 = (this->m_waiting_time).__r;
  while( true ) {
    (this->m_spinlock).m_flag.super___atomic_flag_base._M_i = false;
    do {
      sched_yield();
      LOCK();
      _Var1 = (this->m_spinlock).m_flag.super___atomic_flag_base._M_i;
      (this->m_spinlock).m_flag.super___atomic_flag_base._M_i = true;
      UNLOCK();
    } while (_Var1 != false);
    if (this->m_signaled == true) break;
    lVar4 = std::chrono::_V2::system_clock::now();
    if (lVar3 + lVar2 <= lVar4) {
      local_28._M_device = &this->m_mutex;
      local_28._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_28);
      local_28._M_owns = true;
      (this->m_spinlock).m_flag.super___atomic_flag_base._M_i = false;
      if (this->m_signaled == false) {
        do {
          std::condition_variable::wait((unique_lock *)&this->m_condition);
        } while (this->m_signaled != true);
      }
      while( true ) {
        LOCK();
        _Var1 = (this->m_spinlock).m_flag.super___atomic_flag_base._M_i;
        (this->m_spinlock).m_flag.super___atomic_flag_base._M_i = true;
        UNLOCK();
        if (_Var1 == false) break;
        sched_yield();
      }
      this->m_waiting = false;
      this->m_signaled = false;
      std::unique_lock<std::mutex>::~unique_lock(&local_28);
      return;
    }
  }
  this->m_waiting = false;
  this->m_signaled = false;
  return;
}

Assistant:

SO_5_NOEXCEPT override
			{
				using clock = std::chrono::high_resolution_clock;

				m_waiting = true;
				auto stop_point = clock::now() + m_waiting_time;

				do
					{
						m_spinlock.unlock();

						std::this_thread::yield();

						m_spinlock.lock();

						if( m_signaled )
							{
								m_waiting = false;
								m_signaled = false;
								return;
							}
					}
				while( stop_point > clock::now() );

				// m_lock is locked now.

				// Must use heavy std::mutex and std::condition_variable
				// to allow OS to efficiently use the resources while
				// we are waiting for signal.
				std::unique_lock< std::mutex > mlock( m_mutex );

				m_spinlock.unlock();

				m_condition.wait( mlock, [this]{ return m_signaled; } );

				// At this point m_signaled must be 'true'.

				m_spinlock.lock();

				m_waiting = false;
				m_signaled = false;
			}